

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
viennamath::expression_not_unwrappable_exception::expression_not_unwrappable_exception
          (expression_not_unwrappable_exception *this,string *str)

{
  *(undefined ***)this = &PTR__expression_not_unwrappable_exception_00127f80;
  std::__cxx11::string::string((string *)&this->message_,(string *)str);
  return;
}

Assistant:

expression_not_unwrappable_exception(std::string const & str) : message_(str) {}